

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O2

double __thiscall
PDFUsedFont::CalculateTextAdvance(PDFUsedFont *this,UIntList *inGlyphsList,double inFontSize)

{
  map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
  *this_00;
  _List_node_base *__x;
  size_type sVar1;
  mapped_type_conflict1 *pmVar2;
  mapped_type_conflict1 mVar3;
  _List_node_base *p_Var4;
  long lVar5;
  
  this_00 = &this->mAdvanceCache;
  lVar5 = 0;
  p_Var4 = (_List_node_base *)inGlyphsList;
  while (p_Var4 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var4->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)inGlyphsList) {
    __x = p_Var4 + 1;
    sVar1 = std::
            map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
            ::count(this_00,(key_type_conflict4 *)__x);
    if (sVar1 == 0) {
      mVar3 = FreeTypeFaceWrapper::GetGlyphWidth(&this->mFaceWrapper,*(uint *)&__x->_M_next);
      if ((this->mAdvanceCache)._M_t._M_impl.super__Rb_tree_header._M_node_count < 0xc9) {
        pmVar2 = std::
                 map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
                 ::operator[](this_00,(key_type_conflict4 *)__x);
        *pmVar2 = mVar3;
      }
    }
    else {
      pmVar2 = std::
               map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
               ::operator[](this_00,(key_type_conflict4 *)__x);
      mVar3 = *pmVar2;
    }
    lVar5 = lVar5 + mVar3;
  }
  return ((double)lVar5 * inFontSize) / 1000.0;
}

Assistant:

double PDFUsedFont::CalculateTextAdvance(const UIntList& inGlyphsList,double inFontSize)
{
    FT_Pos pen = 0;
    UIntList::const_iterator it = inGlyphsList.begin();
    for(; it != inGlyphsList.end();++it)
    {
		FT_Pos adv;
		if (mAdvanceCache.count(*it) > 0) 
			adv = mAdvanceCache[*it];
		else {
			adv = mFaceWrapper.GetGlyphWidth(*it); //potentially very expensive!
			if (mAdvanceCache.size() <= AdvanceCacheLimit) //dumb limit should cover typical usage, implement LRU if it's a problem
				mAdvanceCache[*it] = adv;
		}
		pen += adv;
    }
	return pen * inFontSize / 1000.0;
}